

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select_min.hpp
# Opt level: O2

__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
 burst::
 select_min<__gnu_cxx::__normal_iterator<boost::iterator_range<int_const*>*,std::vector<boost::iterator_range<int_const*>,std::allocator<boost::iterator_range<int_const*>>>>,burst::compose_fn<burst::apply_fn<std::less<void>>,burst::compose_fn<burst::by_all_fn<burst::front_t>,burst::forward_as_tuple_fn>>>
           (__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
            first,__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
                  last,
           compose_fn<burst::apply_fn<std::less<void>_>,_burst::compose_fn<burst::by_all_fn<burst::front_t>,_burst::forward_as_tuple_fn>_>
           compare)

{
  iterator_range<const_int_*> *piVar1;
  int *piVar2;
  __normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
  _Var3;
  bool bVar4;
  __normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
  ts;
  iterator_range<const_int_*> *ts_1;
  undefined1 local_3b [3];
  int *local_38;
  int *piStack_30;
  
  if (first._M_current != last._M_current) {
    ts._M_current = first._M_current;
    _Var3._M_current = first._M_current;
    while (ts_1 = _Var3._M_current, piVar1 = ts._M_current, ts._M_current = piVar1 + 1,
          ts._M_current != last._M_current) {
      bVar4 = compose_fn<burst::apply_fn<std::less<void>>,burst::compose_fn<burst::by_all_fn<burst::front_t>,burst::forward_as_tuple_fn>>
              ::operator()(local_3b,ts._M_current,ts_1);
      if (bVar4) {
        local_38 = ((first._M_current)->
                   super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>
                   ).
                   super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>
                   .
                   super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
                   .m_Begin;
        piStack_30 = ((first._M_current)->
                     super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>
                     ).
                     super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>
                     .
                     super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
                     .m_End;
        piVar2 = piVar1[1].
                 super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>
                 .
                 super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>
                 .
                 super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
                 .m_End;
        ((first._M_current)->
        super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>).
        super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>.
        super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>.
        m_Begin = ((ts._M_current)->
                  super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>
                  ).
                  super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>
                  .
                  super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
                  .m_Begin;
        ((first._M_current)->
        super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>).
        super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>.
        super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>.m_End
             = piVar2;
        ((ts._M_current)->
        super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>).
        super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>.
        super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>.
        m_Begin = local_38;
        piVar1[1].
        super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>.
        super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>.
        super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>.m_End
             = piStack_30;
        _Var3._M_current = first._M_current;
      }
      else {
        bVar4 = compose_fn<burst::apply_fn<std::less<void>>,burst::compose_fn<burst::by_all_fn<burst::front_t>,burst::forward_as_tuple_fn>>
                ::operator()(local_3b,ts_1,ts._M_current);
        _Var3._M_current = ts_1;
        if ((!bVar4) && (_Var3._M_current = ts_1 + 1, piVar1 != ts_1)) {
          local_38 = ((_Var3._M_current)->
                     super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>
                     ).
                     super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>
                     .
                     super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
                     .m_Begin;
          piStack_30 = ts_1[1].
                       super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>
                       .
                       super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>
                       .
                       super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
                       .m_End;
          piVar2 = piVar1[1].
                   super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>
                   .
                   super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>
                   .
                   super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
                   .m_End;
          ((_Var3._M_current)->
          super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>).
          super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>.
          super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>.
          m_Begin = ((ts._M_current)->
                    super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>
                    ).
                    super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>
                    .
                    super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
                    .m_Begin;
          ts_1[1].
          super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>.
          super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>.
          super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>.
          m_End = piVar2;
          ((ts._M_current)->
          super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>).
          super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>.
          super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>.
          m_Begin = local_38;
          piVar1[1].
          super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>.
          super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>.
          super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>.
          m_End = piStack_30;
        }
      }
    }
    first._M_current = ts_1 + 1;
  }
  return (__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
          )first._M_current;
}

Assistant:

auto select_min (ForwardIterator first, ForwardIterator last, BinaryPredicate compare)
    {
        if (first != last)
        {
            auto min = first;

            for (auto current = std::next(first); current != last; ++current)
            {
                if (compare(*current, *min))
                {
                    std::iter_swap(first, current);
                    min = first;
                }
                else if (not compare(*min, *current))
                {
                    ++min;
                    if (min != current)
                    {
                        std::iter_swap(min, current);
                    }
                }
            }

            return ++min;
        }

        return first;
    }